

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall
helics::Interface::Interface
          (Interface *this,Federate *federate,InterfaceHandle hid,string_view actName)

{
  element_type *peVar1;
  
  this->_vptr_Interface = (_func_int **)&PTR__Interface_005151b0;
  this->mCore = (Core *)0x0;
  (this->handle).hid = hid.hid;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->mName,actName._M_str,actName._M_str + actName._M_len);
  if ((federate != (Federate *)0x0) &&
     (peVar1 = (federate->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    this->mCore = peVar1;
  }
  return;
}

Assistant:

Interface::Interface(Federate* federate, InterfaceHandle hid, std::string_view actName):
    handle(hid), mName(actName)
{
    if (federate != nullptr) {
        const auto& crp = federate->getCorePointer();
        if (crp) {
            mCore = crp.get();
        }
    }
}